

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

const_iterator __thiscall
QHash<QWidget*,QPointer<QPropertyAnimation>>::constFindImpl<QWidget*>
          (QHash<QWidget*,QPointer<QPropertyAnimation>> *this,QWidget **key)

{
  Data<QHashPrivate::Node<QWidget*,QPointer<QPropertyAnimation>>> *this_00;
  Data<QHashPrivate::Node<QWidget_*,_QPointer<QPropertyAnimation>_>_> *pDVar1;
  ulong uVar2;
  Bucket BVar3;
  const_iterator cVar4;
  
  this_00 = *(Data<QHashPrivate::Node<QWidget*,QPointer<QPropertyAnimation>>> **)this;
  if ((this_00 != (Data<QHashPrivate::Node<QWidget*,QPointer<QPropertyAnimation>>> *)0x0) &&
     (*(long *)(this_00 + 8) != 0)) {
    BVar3 = QHashPrivate::Data<QHashPrivate::Node<QWidget*,QPointer<QPropertyAnimation>>>::
            findBucket<QWidget*>(this_00,key);
    if ((BVar3.span)->offsets[BVar3.index] != 0xff) {
      pDVar1 = *(Data<QHashPrivate::Node<QWidget_*,_QPointer<QPropertyAnimation>_>_> **)this;
      uVar2 = ((long)BVar3.span - (long)pDVar1->spans) / 0x90 << 7 | BVar3.index;
      goto LAB_0037301e;
    }
  }
  uVar2 = 0;
  pDVar1 = (Data<QHashPrivate::Node<QWidget_*,_QPointer<QPropertyAnimation>_>_> *)0x0;
LAB_0037301e:
  cVar4.i.bucket = uVar2;
  cVar4.i.d = pDVar1;
  return (const_iterator)cVar4.i;
}

Assistant:

const_iterator constFindImpl(const K &key) const noexcept
    {
        if (isEmpty())
            return end();
        auto it = d->findBucket(key);
        if (it.isUnused())
            return end();
        return const_iterator({d, it.toBucketIndex(d)});
    }